

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O2

void __thiscall cmOrderDirectories::FindImplicitConflicts(cmOrderDirectories *this)

{
  pointer puVar1;
  cmake *this_00;
  string *args_1;
  unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>
  *entry;
  pointer puVar2;
  undefined1 auStack_1e8 [16];
  string local_1d8;
  string text;
  ostringstream conflicts;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&conflicts);
  puVar1 = (this->ImplicitDirEntries).
           super__Vector_base<std::unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>,_std::allocator<std::unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar2 = (this->ImplicitDirEntries).
                super__Vector_base<std::unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>,_std::allocator<std::unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    cmOrderDirectoriesConstraint::FindImplicitConflicts
              ((puVar2->_M_t).
               super___uniq_ptr_impl<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmOrderDirectoriesConstraint_*,_std::default_delete<cmOrderDirectoriesConstraint>_>
               .super__Head_base<0UL,_cmOrderDirectoriesConstraint_*,_false>._M_head_impl,&conflicts
              );
  }
  std::__cxx11::stringbuf::str();
  if (text._M_string_length != 0) {
    this_00 = this->GlobalGenerator->CMakeInstance;
    args_1 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    cmStrCat<char_const(&)[24],std::__cxx11::string&,char_const(&)[13],std::__cxx11::string_const&,char_const(&)[90],std::__cxx11::string_const&,char_const(&)[52]>
              ((string *)(auStack_1e8 + 0x10),(char (*) [24])"Cannot generate a safe ",
               &this->Purpose,(char (*) [13])0x69e8ea,args_1,
               (char (*) [90])
               " because files in some directories may conflict with  libraries in implicit directories:\n"
               ,&text,(char (*) [52])"Some of these libraries may not be found correctly.");
    cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)auStack_1e8);
    cmake::IssueMessage(this_00,WARNING,(string *)(auStack_1e8 + 0x10),
                        (cmListFileBacktrace *)auStack_1e8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_1e8 + 8));
    std::__cxx11::string::~string((string *)(auStack_1e8 + 0x10));
  }
  std::__cxx11::string::~string((string *)&text);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&conflicts);
  return;
}

Assistant:

void cmOrderDirectories::FindImplicitConflicts()
{
  // Check for items in implicit link directories that have conflicts
  // in the explicit directories.
  std::ostringstream conflicts;
  for (const auto& entry : this->ImplicitDirEntries) {
    entry->FindImplicitConflicts(conflicts);
  }

  // Skip warning if there were no conflicts.
  std::string const text = conflicts.str();
  if (text.empty()) {
    return;
  }

  // Warn about the conflicts.
  this->GlobalGenerator->GetCMakeInstance()->IssueMessage(
    MessageType::WARNING,
    cmStrCat("Cannot generate a safe ", this->Purpose, " for target ",
             this->Target->GetName(),
             " because files in some directories may "
             "conflict with  libraries in implicit directories:\n",
             text, "Some of these libraries may not be found correctly."),
    this->Target->GetBacktrace());
}